

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_rate.c
# Opt level: O2

double inform_entropy_rate(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  ulong uVar2;
  uint32_t *__ptr;
  size_t sVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  size_t j_1;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  inform_dist histories;
  inform_dist states;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  dVar10 = NAN;
  if (!_Var1) {
    auVar11._8_4_ = (int)(k >> 0x20);
    auVar11._0_8_ = k;
    auVar11._12_4_ = 0x45300000;
    dVar10 = pow((double)b,
                 (auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar10 = dVar10 * (double)b;
    uVar2 = (ulong)dVar10;
    uVar2 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    __ptr = (uint32_t *)calloc(uVar2 / (ulong)(long)b + uVar2,4);
    if (__ptr == (uint32_t *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar10 = NAN;
    }
    else {
      histories.counts = (m - k) * n;
      histories.histogram = __ptr + uVar2;
      for (sVar3 = 0; sVar3 != n; sVar3 = sVar3 + 1) {
        iVar4 = 0;
        iVar6 = 1;
        for (sVar7 = 0; piVar8 = series, uVar9 = k, k != sVar7; sVar7 = sVar7 + 1) {
          iVar6 = iVar6 * b;
          iVar4 = iVar4 * b + series[sVar7];
        }
        for (; uVar9 < m; uVar9 = uVar9 + 1) {
          lVar5 = (long)(iVar4 * b) + (long)piVar8[k];
          __ptr[lVar5] = __ptr[lVar5] + 1;
          histories.histogram[iVar4] = histories.histogram[iVar4] + 1;
          iVar4 = (int)lVar5 - *piVar8 * iVar6;
          piVar8 = piVar8 + 1;
        }
        series = series + m;
      }
      histories.size = uVar2 / (ulong)(long)b;
      states.histogram = __ptr;
      states.size = uVar2;
      states.counts = histories.counts;
      dVar10 = inform_shannon_ce(&states,&histories,2.0);
      free(__ptr);
    }
  }
  return dVar10;
}

Assistant:

double inform_entropy_rate(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const N = n * (m - k);

    size_t const states_size = (size_t) (b * pow((double) b, (double) k));
    size_t const histories_size = states_size / b;
    size_t const total_size = states_size + histories_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };

    accumulate_observations(series, n, m, b, k, &states, &histories);

    double er = inform_shannon_ce(&states, &histories, 2.0);

    free(data);

    return er;
}